

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O3

void __thiscall
OpenMD::LJ::addExplicitInteraction
          (LJ *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  int atid2;
  int atid1;
  int local_40;
  int local_3c;
  double local_38;
  RealType local_30;
  RealType local_28;
  
  local_38 = 1.0;
  local_30 = sigma;
  local_28 = epsilon;
  local_3c = AtomType::getIdent(atype1);
  local_40 = AtomType::getIdent(atype2);
  pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->LJtypes,&local_3c);
  if (pVar8.second == false) {
    iVar7 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_3c];
  }
  else {
    iVar7 = this->nLJ_;
    (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_3c] = iVar7;
    this->nLJ_ = iVar7 + 1;
  }
  local_38 = local_38 / local_30;
  pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->LJtypes,&local_40);
  if (pVar8.second == false) {
    iVar5 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_40];
    iVar2 = this->nLJ_;
  }
  else {
    iVar5 = this->nLJ_;
    (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_40] = iVar5;
    iVar2 = iVar5 + 1;
    this->nLJ_ = iVar2;
  }
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::resize(&this->MixingMap,(long)iVar2);
  lVar6 = (long)iVar7;
  std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar6,(long)this->nLJ_);
  lVar3 = (long)iVar5;
  lVar1 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar6].
                    super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar4 = lVar3 * 0x20;
  *(RealType *)(lVar1 + lVar4) = local_30;
  *(RealType *)(lVar1 + 8 + lVar4) = local_28;
  *(double *)(lVar1 + 0x10 + lVar4) = local_38;
  *(undefined1 *)(lVar1 + 0x18 + lVar4) = 1;
  if (iVar5 != iVar7) {
    std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar3,(long)this->nLJ_);
    lVar1 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar3].
                      super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar6 = lVar6 * 0x20;
    *(RealType *)(lVar1 + lVar6) = local_30;
    *(RealType *)(lVar1 + 8 + lVar6) = local_28;
    *(double *)(lVar1 + 0x10 + lVar6) = local_38;
    *(undefined1 *)(lVar1 + 0x18 + lVar6) = 1;
  }
  return;
}

Assistant:

void LJ::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                  RealType sigma, RealType epsilon) {
    LJInteractionData mixer;
    mixer.sigma         = sigma;
    mixer.epsilon       = epsilon;
    mixer.sigmai        = 1.0 / mixer.sigma;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int ljtid1, ljtid2;

    pair<set<int>::iterator, bool> ret;
    ret = LJtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the LJMap, just get the ljtid:
      ljtid1 = LJtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      ljtid1        = nLJ_;
      LJtids[atid1] = nLJ_;
      nLJ_++;
    }

    ret = LJtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the LJMap, just get the ljtid:
      ljtid2 = LJtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      ljtid2        = nLJ_;
      LJtids[atid2] = nLJ_;
      nLJ_++;
    }

    MixingMap.resize(nLJ_);
    MixingMap[ljtid1].resize(nLJ_);

    MixingMap[ljtid1][ljtid2] = mixer;
    if (ljtid2 != ljtid1) {
      MixingMap[ljtid2].resize(nLJ_);
      MixingMap[ljtid2][ljtid1] = mixer;
    }
  }